

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog_p.h
# Opt level: O0

void __thiscall QAutoPointer<QFileDialog>::~QAutoPointer(QAutoPointer<QFileDialog> *this)

{
  QFileDialog *pQVar1;
  
  pQVar1 = ::QPointer::operator_cast_to_QFileDialog_((QPointer<QFileDialog> *)0x7688db);
  if (pQVar1 != (QFileDialog *)0x0) {
    (**(code **)(*(long *)&(pQVar1->super_QDialog).super_QWidget + 0x20))();
  }
  QPointer<QFileDialog>::~QPointer((QPointer<QFileDialog> *)0x7688fa);
  return;
}

Assistant:

~QAutoPointer() { delete o; }